

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O0

void __thiscall arm::LabelInst::~LabelInst(LabelInst *this)

{
  LabelInst *in_RDI;
  
  ~LabelInst(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~LabelInst() {}